

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O3

void Psr_ManCleanMap(Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  uVar8 = (pNtk->vInputs).nSize;
  uVar6 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar5 = 0;
    do {
      if ((int)uVar6 <= lVar5) goto LAB_003b803f;
      uVar8 = (pNtk->vInputs).pArray[lVar5];
      if ((ulong)uVar8 == 0) break;
      if (((int)uVar8 < 0) || (vMap->nSize <= (int)uVar8)) goto LAB_003b7fe2;
      vMap->pArray[uVar8] = -1;
      lVar5 = lVar5 + 1;
      uVar6 = (ulong)(pNtk->vInputs).nSize;
    } while (lVar5 < (long)uVar6);
  }
  if (0 < (pNtk->vObjs).nSize) {
    piVar3 = (pNtk->vObjs).pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar3[lVar5];
      if (((long)iVar1 < 0) || (uVar8 = (pNtk->vBoxes).nSize, (int)uVar8 <= iVar1))
      goto LAB_003b803f;
      piVar4 = (pNtk->vBoxes).pArray;
      iVar1 = piVar4[iVar1];
      Psr_BoxSignals_V._0_4_ = iVar1 + -2;
      iVar2 = piVar3[lVar5];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((iVar2 < -3) || (uVar9 = iVar2 + 3, uVar8 <= uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar4 = piVar4 + uVar9;
      Psr_BoxSignals_V._8_8_ = piVar4;
      if (3 < iVar1) {
        lVar7 = 1;
        do {
          uVar8 = piVar4[lVar7];
          if ((pNtk->field_0x4 & 2) == 0) {
            if ((int)uVar8 < 0) goto LAB_003b7fe2;
          }
          else {
            if ((int)uVar8 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x13e,"int Abc_Lit2Att2(int)");
            }
            if ((uVar8 & 3) != 0) {
              __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                            ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
            }
            uVar8 = uVar8 >> 2;
          }
          if (vMap->nSize <= (int)uVar8) goto LAB_003b7fe2;
          vMap->pArray[uVar8] = -1;
          lVar7 = lVar7 + 2;
        } while ((int)lVar7 < (int)Psr_BoxSignals_V._4_4_);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vObjs).nSize);
  }
  uVar8 = (pNtk->vOutputs).nSize;
  uVar6 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar5 = 0;
    do {
      if ((int)uVar6 <= lVar5) {
LAB_003b803f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = (pNtk->vOutputs).pArray[lVar5];
      if ((ulong)uVar8 == 0) {
        return;
      }
      if (((int)uVar8 < 0) || (vMap->nSize <= (int)uVar8)) {
LAB_003b7fe2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vMap->pArray[uVar8] = -1;
      lVar5 = lVar5 + 1;
      uVar6 = (ulong)(pNtk->vOutputs).nSize;
    } while (lVar5 < (long)uVar6);
  }
  return;
}

Assistant:

void Psr_ManCleanMap( Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; 
    int i, k, NameId, Sig;
    Psr_NtkForEachPi( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachBox( pNtk, vSigs, i )
        Vec_IntForEachEntryDouble( vSigs, NameId, Sig, k )
            Vec_IntWriteEntry( vMap, Psr_NtkSigName(pNtk, Sig), -1 );
    Psr_NtkForEachPo( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}